

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O2

void __thiscall
OpenMD::ForceMatrixDecomposition::~ForceMatrixDecomposition(ForceMatrixDecomposition *this)

{
  ~ForceMatrixDecomposition(this);
  operator_delete(this,0x318);
  return;
}

Assistant:

ForceMatrixDecomposition::~ForceMatrixDecomposition() {
#ifdef IS_MPI
    delete AtomPlanIntRow;
    delete AtomPlanRealRow;
    delete AtomPlanVectorRow;
    delete AtomPlanMatrixRow;
    delete AtomPlanPotRow;
    delete AtomPlanIntColumn;
    delete AtomPlanRealColumn;
    delete AtomPlanVectorColumn;
    delete AtomPlanMatrixColumn;
    delete AtomPlanPotColumn;
    delete cgPlanIntRow;
    delete cgPlanVectorRow;
    delete cgPlanIntColumn;
    delete cgPlanVectorColumn;
#endif
  }